

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclConfig.cpp
# Opt level: O0

ssize_t __thiscall xmrig::OclConfig::read(OclConfig *this,int __fd,void *__buf,size_t __nbytes)

{
  bool bVar1;
  undefined1 uVar2;
  ssize_t extraout_RAX;
  ssize_t extraout_RAX_00;
  ssize_t extraout_RAX_01;
  ssize_t sVar3;
  undefined7 uVar4;
  void *__buf_00;
  undefined4 in_register_00000034;
  OclConfig *this_00;
  char *unaff_retaddr;
  Value *in_stack_00000008;
  char *in_stack_00000068;
  OclConfig *in_stack_00000070;
  int __fd_00;
  OclConfig *obj;
  
  this_00 = (OclConfig *)CONCAT44(in_register_00000034,__fd);
  uVar4 = (undefined7)(__nbytes >> 8);
  obj = this;
  bVar1 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::IsObject((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)this_00);
  if (bVar1) {
    bVar1 = Json::getBool(in_stack_00000008,unaff_retaddr,SUB81((ulong)obj >> 0x38,0));
    this->m_enabled = bVar1;
    uVar2 = Json::getBool(in_stack_00000008,unaff_retaddr,SUB81((ulong)obj >> 0x38,0));
    this->m_cache = (bool)uVar2;
    Json::getString(in_stack_00000008,unaff_retaddr,&obj->m_cache);
    String::operator=((String *)this_00,&this->m_cache);
    Json::getValue((Value *)obj,&this_00->m_cache);
    setPlatform(this_00,(Value *)this);
    __fd_00 = (int)this_00;
    Json::getString(in_stack_00000008,unaff_retaddr,&obj->m_cache);
    setDevicesHint(in_stack_00000070,in_stack_00000068);
    Threads<xmrig::OclThreads>::read(&this->m_threads,__fd_00,__buf_00,CONCAT71(uVar4,uVar2));
    generate(in_stack_00000070);
    sVar3 = extraout_RAX;
  }
  else {
    bVar1 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::IsBool((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)this_00);
    if (bVar1) {
      bVar1 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::GetBool((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                         *)this_00);
      this->m_enabled = bVar1;
      generate(in_stack_00000070);
      sVar3 = extraout_RAX_00;
    }
    else {
      this->m_shouldSave = true;
      generate(in_stack_00000070);
      sVar3 = extraout_RAX_01;
    }
  }
  return sVar3;
}

Assistant:

void xmrig::OclConfig::read(const rapidjson::Value &value)
{
    if (value.IsObject()) {
        m_enabled   = Json::getBool(value, kEnabled, m_enabled);
        m_cache     = Json::getBool(value, kCache, m_cache);
        m_loader    = Json::getString(value, kLoader);

        setPlatform(Json::getValue(value, kPlatform));
        setDevicesHint(Json::getString(value, kDevicesHint));

        m_threads.read(value);

        generate();
    }
    else if (value.IsBool()) {
        m_enabled = value.GetBool();

        generate();
    }
    else {
        m_shouldSave = true;

        generate();
    }
}